

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.c
# Opt level: O3

int GetResidualCost_C(int ctx0,VP8Residual *res)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  ProbaArray *paauVar4;
  long lVar5;
  long lVar6;
  uint8_t (*pauVar7) [11];
  uint uVar8;
  ushort uVar9;
  uint16_t *puVar10;
  int iVar11;
  CostArrayPtr papuVar12;
  long lVar13;
  uint uVar14;
  
  iVar11 = res->first;
  paauVar4 = res->prob;
  lVar5 = (long)iVar11;
  bVar1 = paauVar4[lVar5][ctx0][0];
  uVar8 = 0;
  if (ctx0 == 0) {
    uVar8 = (uint)VP8EntropyCost[(byte)~bVar1];
  }
  iVar3 = res->last;
  lVar13 = (long)iVar3;
  if (lVar13 < 0) {
    uVar8 = (uint)VP8EntropyCost[bVar1];
  }
  else {
    puVar10 = res->costs[lVar5][ctx0];
    lVar6 = lVar5;
    if (iVar11 < iVar3) {
      papuVar12 = res->costs + lVar5;
      do {
        papuVar12 = papuVar12 + 1;
        uVar2 = res->coeffs[lVar5];
        uVar9 = -uVar2;
        if (0 < (short)uVar2) {
          uVar9 = uVar2;
        }
        uVar14 = 0x43;
        if (uVar9 < 0x43) {
          uVar14 = (uint)uVar9;
        }
        uVar8 = uVar8 + VP8LevelFixedCosts[uVar9] + (uint)puVar10[uVar14];
        lVar5 = lVar5 + 1;
        uVar14 = 2;
        if (uVar9 < 2) {
          uVar14 = (uint)uVar9;
        }
        puVar10 = (*papuVar12)[uVar14];
        lVar6 = lVar13;
        iVar11 = iVar3;
      } while (lVar13 != lVar5);
    }
    uVar2 = res->coeffs[lVar6];
    uVar9 = -uVar2;
    if (0 < (short)uVar2) {
      uVar9 = uVar2;
    }
    uVar14 = 0x43;
    if (uVar9 < 0x43) {
      uVar14 = (uint)uVar9;
    }
    uVar8 = VP8LevelFixedCosts[uVar9] + uVar8 + (uint)puVar10[uVar14];
    if (iVar11 < 0xf) {
      pauVar7 = *paauVar4 + 1;
      if (uVar9 != 1) {
        pauVar7 = *paauVar4 + 2;
      }
      uVar8 = uVar8 + VP8EntropyCost
                      [*(byte *)((long)pauVar7 +
                                (ulong)""[(long)iVar11 + 1] * 0x20 + (ulong)""[(long)iVar11 + 1])];
    }
  }
  return uVar8;
}

Assistant:

static int GetResidualCost_C(int ctx0, const VP8Residual* const res) {
  int n = res->first;
  // should be prob[VP8EncBands[n]], but it's equivalent for n=0 or 1
  const int p0 = res->prob[n][ctx0][0];
  CostArrayPtr const costs = res->costs;
  const uint16_t* t = costs[n][ctx0];
  // bit_cost(1, p0) is already incorporated in t[] tables, but only if ctx != 0
  // (as required by the syntax). For ctx0 == 0, we need to add it here or it'll
  // be missing during the loop.
  int cost = (ctx0 == 0) ? VP8BitCost(1, p0) : 0;

  if (res->last < 0) {
    return VP8BitCost(0, p0);
  }
  for (; n < res->last; ++n) {
    const int v = abs(res->coeffs[n]);
    const int ctx = (v >= 2) ? 2 : v;
    cost += VP8LevelCost(t, v);
    t = costs[n + 1][ctx];
  }
  // Last coefficient is always non-zero
  {
    const int v = abs(res->coeffs[n]);
    assert(v != 0);
    cost += VP8LevelCost(t, v);
    if (n < 15) {
      const int b = VP8EncBands[n + 1];
      const int ctx = (v == 1) ? 1 : 2;
      const int last_p0 = res->prob[b][ctx][0];
      cost += VP8BitCost(0, last_p0);
    }
  }
  return cost;
}